

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O0

void * deMemPool_alignedAlloc(deMemPool *pool,size_t numBytes,deUint32 alignBytes)

{
  void *pvVar1;
  void *ptr;
  deUint32 alignBytes_local;
  size_t numBytes_local;
  deMemPool *pool_local;
  
  pvVar1 = deMemPool_allocInternal(pool,numBytes,alignBytes);
  if ((pvVar1 == (void *)0x0) && (pool->util != (deMemPoolUtil *)0x0)) {
    (*pool->util->allocFailCallback)(pool->util->userPointer);
  }
  return pvVar1;
}

Assistant:

void* deMemPool_alignedAlloc (deMemPool* pool, size_t numBytes, deUint32 alignBytes)
{
	void* ptr;
	DE_ASSERT(pool);
	DE_ASSERT(numBytes > 0);
	DE_ASSERT(deIsPowerOfTwo32((int)alignBytes));
	ptr = deMemPool_allocInternal(pool, numBytes, alignBytes);
	DE_ASSERT(deIsAlignedPtr(ptr, alignBytes));
	if (!ptr && pool->util)
		pool->util->allocFailCallback(pool->util->userPointer);
	return ptr;
}